

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QMultiHash<QByteArray,_QByteArray> * __thiscall
QMultiHash<QByteArray,_QByteArray>::unite
          (QMultiHash<QByteArray,_QByteArray> *this,QHash<QByteArray,_QByteArray> *other)

{
  Entry *pEVar1;
  ulong uVar2;
  ulong uVar3;
  Data *pDVar4;
  long in_FS_OFFSET;
  iterator local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = other->d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else if (pDVar4->spans->offsets[0] == 0xff) {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (pDVar4->numBuckets == uVar3) {
        pDVar4 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar2 = uVar3 + 1;
    } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    goto LAB_0010ecb6;
  }
  uVar3 = 0;
LAB_0010ecb6:
  if (uVar3 != 0 || pDVar4 != (Data *)0x0) {
    do {
      pEVar1 = pDVar4->spans[uVar3 >> 7].entries;
      uVar2 = (ulong)((uint)pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] * 0x30);
      QMultiHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                (&local_40,this,(QByteArray *)((pEVar1->storage).data + uVar2),
                 (QByteArray *)((pEVar1->storage).data + uVar2 + 0x18));
      do {
        if (pDVar4->numBuckets - 1 == uVar3) {
          uVar3 = 0;
          pDVar4 = (Data *)0x0;
          break;
        }
        uVar3 = uVar3 + 1;
      } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    } while (uVar3 != 0 || pDVar4 != (Data *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QMultiHash &unite(const QHash<Key, T> &other)
    {
        for (auto cit = other.cbegin(); cit != other.cend(); ++cit)
            insert(cit.key(), *cit);
        return *this;
    }